

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O0

type dlib::
     matrix_assign_default<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_exp<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
                      *src)

{
  long lVar1;
  const_ret_type pfVar2;
  float *pfVar3;
  long c;
  long r;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
  *this;
  matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
  *local_20;
  long local_18;
  
  local_18 = 0;
  while( true ) {
    lVar1 = matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
            ::nr((matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
                  *)0x29bedb);
    if (lVar1 <= local_18) break;
    local_20 = (matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
                *)0x0;
    while( true ) {
      this = local_20;
      lVar1 = matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
              ::nc((matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
                    *)0x29bf09);
      if (lVar1 <= (long)this) break;
      pfVar2 = matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
               ::operator()(this,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            0x29bf2a);
      in_stack_ffffffffffffffcc = *pfVar2;
      pfVar3 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               ::operator()((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                             *)this,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            0x29bf48);
      *pfVar3 = in_stack_ffffffffffffffcc;
      local_20 = local_20 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - #dest == src
    !*/
    {
        for (long r = 0; r < src.nr(); ++r)
        {
            for (long c = 0; c < src.nc(); ++c)
            {
                dest(r,c) = src(r,c);
            }
        }
    }